

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::TimeCoordinator::updateValueTime
          (TimeCoordinator *this,Time valueUpdateTime,bool allowRequestSend)

{
  bool bVar1;
  byte in_DL;
  TimeRepresentation<count_time<9,_long>_> in_RSI;
  long in_RDI;
  Time nextPossibleTime;
  Time ptime;
  TimeCoordinator *in_stack_000001d8;
  GlobalFederateId in_stack_000001e4;
  undefined8 *local_40;
  GlobalFederateId local_2c;
  TimeRepresentation<count_time<9,_long>_> local_28;
  TimeRepresentation<count_time<9,_long>_> local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  if ((*(byte *)(in_RDI + 0x53) & 1) == 0) {
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)&stack0xfffffffffffffff8,
                       (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
    if (bVar1) {
      *(undefined1 *)(in_RDI + 0x25a) = 1;
    }
  }
  else {
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                      ((TimeRepresentation<count_time<9,_long>_> *)&stack0xfffffffffffffff8,
                       (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x130));
    if (bVar1) {
      *(undefined1 *)(in_RDI + 0x25b) = 1;
    }
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)&stack0xfffffffffffffff8,
                       (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x170));
    if (bVar1) {
      local_20.internalTimeCode = *(baseType *)(in_RDI + 0x170);
      if (*(char *)(in_RDI + 0x259) == '\0') {
        local_28.internalTimeCode = (baseType)getNextPossibleTime(in_RSI.internalTimeCode);
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                          ((TimeRepresentation<count_time<9,_long>_> *)&stack0xfffffffffffffff8,
                           &local_28);
        if (bVar1) {
          *(baseType *)(in_RDI + 0x170) = local_28.internalTimeCode;
        }
        else {
          *(baseType *)(in_RDI + 0x170) = in_RSI.internalTimeCode;
        }
      }
      else {
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                          ((TimeRepresentation<count_time<9,_long>_> *)&stack0xfffffffffffffff8,
                           (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x130));
        if (bVar1) {
          local_40 = (undefined8 *)(in_RDI + 0x130);
        }
        else {
          local_40 = (undefined8 *)&stack0xfffffffffffffff8;
        }
        *(undefined8 *)(in_RDI + 0x170) = *local_40;
      }
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                        ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x170),&local_20);
      if ((((bVar1) && ((*(byte *)(in_RDI + 0x57) & 1) == 0)) &&
          (bVar1 = updateNextExecutionTime((TimeCoordinator *)valueUpdateTime.internalTimeCode),
          bVar1)) && ((local_11 & 1) != 0)) {
        memset(&local_2c,0,4);
        GlobalFederateId::GlobalFederateId(&local_2c);
        sendTimeRequest(in_stack_000001d8,in_stack_000001e4);
      }
    }
  }
  return;
}

Assistant:

void TimeCoordinator::updateValueTime(Time valueUpdateTime, bool allowRequestSend)
{
    if (!executionMode)  // updates before exec mode
    {
        if (valueUpdateTime < timeZero) {
            hasInitUpdates = true;
        }
        return;
    }
    if (valueUpdateTime <= time_granted) {
        hasIterationData = true;
    }
    if (valueUpdateTime < time_value) {
        auto ptime = time_value;
        if (iterating != IterationRequest::NO_ITERATIONS) {
            time_value = (valueUpdateTime <= time_granted) ? time_granted : valueUpdateTime;
        } else {
            auto nextPossibleTime = getNextPossibleTime();
            if (valueUpdateTime <= nextPossibleTime) {
                time_value = nextPossibleTime;
            } else {
                time_value = valueUpdateTime;
            }
        }
        if (time_value < ptime && !disconnected) {
            if (updateNextExecutionTime()) {
                if (allowRequestSend) {
                    sendTimeRequest(GlobalFederateId{});
                }
            }
        }
    }
}